

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDEdgePtr __thiscall
ON_SubD_FixedSizeHeap::AllocateEdge
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *v0,double v0_sector_coefficient,
          ON_SubDVertex *v1,double v1_sector_coefficient)

{
  ushort uVar1;
  ON_SubDEdge *pOVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ON_SubDEdgePtr OVar6;
  ON_SubDEdge *edge;
  bool bVar7;
  bool bVar8;
  
  if ((((v0 != (ON_SubDVertex *)0x0) && (v0->m_edges == (ON_SubDEdgePtr *)0x0)) ||
      ((v1 != (ON_SubDVertex *)0x0 && (v1->m_edges == (ON_SubDEdgePtr *)0x0)))) ||
     ((this->m_e == (ON_SubDEdge *)0x0 || (this->m_e_capacity <= this->m_e_index))))
  goto LAB_006137fe;
  if (v0 == (ON_SubDVertex *)0x0) {
LAB_0061366d:
    bVar7 = false;
  }
  else {
    if ((v0->m_edges == (ON_SubDEdgePtr *)0x0) || (v0->m_edge_capacity <= v0->m_edge_count))
    goto LAB_006137fe;
    if (v0->m_vertex_tag == Smooth) {
      v0_sector_coefficient = 0.0;
      goto LAB_0061366d;
    }
    bVar7 = v0->m_vertex_tag != Unset;
  }
  if (v1 == (ON_SubDVertex *)0x0) {
LAB_006136a3:
    bVar8 = false;
  }
  else {
    if ((v1->m_edges == (ON_SubDEdgePtr *)0x0) || (v1->m_edge_capacity <= v1->m_edge_count))
    goto LAB_006137fe;
    if (v1->m_vertex_tag == Smooth) {
      v1_sector_coefficient = 0.0;
      goto LAB_006136a3;
    }
    bVar8 = v0->m_vertex_tag != Unset;
    if ((bVar7 & bVar8) == 1) {
      v0_sector_coefficient = 0.0;
      bVar8 = true;
      v1_sector_coefficient = v0_sector_coefficient;
    }
  }
  bVar3 = ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient,true);
  if (bVar3) {
    bVar3 = ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient,true);
    if (bVar3) {
      edge = this->m_e + this->m_e_index;
      memset(edge,0,0xb0);
      uVar4 = this->m_e_index;
      if (uVar4 != 0) {
        pOVar2 = this->m_e;
        pOVar2[uVar4 - 1].m_next_edge = edge;
        edge->m_prev_edge = pOVar2 + (uVar4 - 1);
      }
      this->m_e_index = uVar4 + 1;
      (edge->super_ON_SubDComponentBase).m_id = uVar4 + 1;
      if (v0 != (ON_SubDVertex *)0x0) {
        edge->m_vertex[0] = v0;
        OVar6 = ON_SubDEdgePtr::Create(edge,0);
        uVar1 = v0->m_edge_count;
        v0->m_edge_count = uVar1 + 1;
        v0->m_edges[uVar1].m_ptr = OVar6.m_ptr;
        uVar4 = ON_SubDComponentBase::SubdivisionLevel(&v0->super_ON_SubDComponentBase);
        ON_SubDComponentBase::SetSubdivisionLevel(&edge->super_ON_SubDComponentBase,uVar4);
      }
      if (v1 != (ON_SubDVertex *)0x0) {
        edge->m_vertex[1] = v1;
        OVar6 = ON_SubDEdgePtr::Create(edge,1);
        uVar1 = v1->m_edge_count;
        v1->m_edge_count = uVar1 + 1;
        v1->m_edges[uVar1].m_ptr = OVar6.m_ptr;
        uVar4 = ON_SubDComponentBase::SubdivisionLevel(&edge->super_ON_SubDComponentBase);
        uVar5 = ON_SubDComponentBase::SubdivisionLevel(&v1->super_ON_SubDComponentBase);
        if (uVar4 < uVar5) {
          uVar4 = ON_SubDComponentBase::SubdivisionLevel(&v1->super_ON_SubDComponentBase);
          ON_SubDComponentBase::SetSubdivisionLevel(&edge->super_ON_SubDComponentBase,uVar4);
        }
      }
      edge->m_sector_coefficient[0] = v0_sector_coefficient;
      edge->m_sector_coefficient[1] = v1_sector_coefficient;
      edge->m_edge_tag = (bVar7 & bVar8) + Smooth;
      OVar6 = ON_SubDEdgePtr::Create(edge,0);
      return (ON_SubDEdgePtr)OVar6.m_ptr;
    }
  }
LAB_006137fe:
  ON_SubDIncrementErrorCount();
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubD_FixedSizeHeap::AllocateEdge(
  ON_SubDVertex* v0,
  double v0_sector_coefficient,
  ON_SubDVertex* v1,
  double v1_sector_coefficient
  )
{
  if ( nullptr != v0 && nullptr == v0->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if ( nullptr != v1 && nullptr == v1->m_edges)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if (nullptr == m_e || m_e_index >= m_e_capacity)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  bool bTaggedVertex[2];
  if (nullptr != v0)
  {
    if (nullptr == v0->m_edges || v0->m_edge_count >= v0->m_edge_capacity)
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    if (ON_SubDVertexTag::Smooth == v0->m_vertex_tag)
    {
      bTaggedVertex[0] = false;
      v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      bTaggedVertex[0] = (ON_SubDVertexTag::Unset != v0->m_vertex_tag);
    }
  }
  else
    bTaggedVertex[0] = false;

  if (nullptr != v1)
  {
    if (nullptr == v1->m_edges || v1->m_edge_count >= v1->m_edge_capacity)
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    if (ON_SubDVertexTag::Smooth == v1->m_vertex_tag)
    {
      bTaggedVertex[1] = false;
      v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      bTaggedVertex[1] = (ON_SubDVertexTag::Unset != v0->m_vertex_tag);
      if (bTaggedVertex[0] && bTaggedVertex[1])
      {
        // crease edge - no weights
        v0_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
        v1_sector_coefficient = ON_SubDSectorType::IgnoredSectorCoefficient;
      }
    }
  }
  else
    bTaggedVertex[1] = false;

  if ( false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  if ( false == ON_SubDSectorType::IsValidSectorCoefficientValue(v1_sector_coefficient, true))
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  ON_SubDEdge* e = m_e + m_e_index;
  memset(e, 0, sizeof(*e));
  if (m_e_index > 0)
  {
    // code in ON_SubDFaceNeighborhood.Subdivide() relies on m_next_edge being set this way.
    m_e[m_e_index - 1].m_next_edge = e;
    e->m_prev_edge = &m_e[m_e_index - 1];
  }

  e->m_id = ++m_e_index;

  if (nullptr != v0)
  {
    e->m_vertex[0] = v0;
    v0->m_edges[v0->m_edge_count++] = ON_SubDEdgePtr::Create(e,0);
    //v0->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
    e->SetSubdivisionLevel(v0->SubdivisionLevel());
  }

  if (nullptr != v1)
  {
    e->m_vertex[1] = v1;
    v1->m_edges[v1->m_edge_count++] = ON_SubDEdgePtr::Create(e,1);
    //v1->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
    if ( e->SubdivisionLevel() < v1->SubdivisionLevel())
      e->SetSubdivisionLevel(v1->SubdivisionLevel());
  }

  e->m_sector_coefficient[0] = v0_sector_coefficient;
  e->m_sector_coefficient[1] = v1_sector_coefficient;
  e->m_edge_tag = (bTaggedVertex[0] && bTaggedVertex[1]) ? ON_SubDEdgeTag::Crease : ON_SubDEdgeTag::Smooth;

  return ON_SubDEdgePtr::Create(e,0);
}